

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderSwitchTests.cpp
# Opt level: O2

void deqp::makeSwitchCases
               (TestCaseGroup *group,GLSLVersion glslVersion,char *name,char *desc,
               LineStream *switchBody)

{
  Context *pCVar1;
  char *__rhs;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  allocator<char> local_e5;
  GLSLVersion local_e4;
  TestCaseGroup *local_e0;
  long local_d8;
  char **local_d0;
  char *local_c8;
  LineStream *local_c0;
  char *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = makeSwitchCases::switchTypeNames;
  local_e4 = glslVersion;
  local_e0 = group;
  local_c8 = desc;
  local_c0 = switchBody;
  local_b8 = name;
  for (local_d8 = 0; local_d8 != 3; local_d8 = local_d8 + 1) {
    pCVar1 = local_e0->m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_b8,&local_e5);
    std::operator+(&local_70,&local_90,"_");
    __rhs = *local_d0;
    std::operator+(&local_50,&local_70,__rhs);
    std::operator+(&local_b0,&local_50,"_vertex");
    pTVar3 = &makeSwitchCase(pCVar1,local_e4,local_b0._M_dataplus._M_p,local_c8,(SwitchType)local_d8
                             ,true,local_c0)->super_TestNode;
    pTVar2 = local_e0;
    tcu::TestNode::addChild((TestNode *)local_e0,pTVar3);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pCVar1 = pTVar2->m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_b8,&local_e5);
    std::operator+(&local_70,&local_90,"_");
    std::operator+(&local_50,&local_70,__rhs);
    std::operator+(&local_b0,&local_50,"_fragment");
    pTVar3 = &makeSwitchCase(pCVar1,local_e4,local_b0._M_dataplus._M_p,local_c8,(SwitchType)local_d8
                             ,false,local_c0)->super_TestNode;
    tcu::TestNode::addChild((TestNode *)local_e0,pTVar3);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    local_d0 = local_d0 + 1;
  }
  return;
}

Assistant:

static void makeSwitchCases(TestCaseGroup* group, glu::GLSLVersion glslVersion, const char* name, const char* desc,
							const LineStream& switchBody)
{
	static const char* switchTypeNames[] = { "static", "uniform", "dynamic" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(switchTypeNames) == SWITCHTYPE_LAST);

	for (int type = 0; type < SWITCHTYPE_LAST; type++)
	{
		group->addChild(makeSwitchCase(group->getContext(), glslVersion,
									   (string(name) + "_" + switchTypeNames[type] + "_vertex").c_str(), desc,
									   (SwitchType)type, true, switchBody));
		group->addChild(makeSwitchCase(group->getContext(), glslVersion,
									   (string(name) + "_" + switchTypeNames[type] + "_fragment").c_str(), desc,
									   (SwitchType)type, false, switchBody));
	}
}